

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.cpp
# Opt level: O2

int __thiscall
DeviceTy::associatePtr(DeviceTy *this,void *HstPtrBegin,void *TgtPtrBegin,int64_t Size)

{
  mutex *__mutex;
  long lVar1;
  _List_node_base *p_Var2;
  HostDataToTargetListTy *this_00;
  value_type local_58;
  
  __mutex = &this->DataMapMtx;
  std::mutex::lock(__mutex);
  this_00 = &this->HostDataToTargetMap;
  p_Var2 = (_List_node_base *)this_00;
  do {
    p_Var2 = (((_List_base<HostDataToTargetTy,_std::allocator<HostDataToTargetTy>_> *)
              &p_Var2->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    if (p_Var2 == (_List_node_base *)this_00) {
      local_58.HstPtrEnd = Size + (long)HstPtrBegin;
      local_58.RefCount = 0x3fffffffffffffff;
      local_58.HstPtrBase = (uintptr_t)HstPtrBegin;
      local_58.HstPtrBegin = (uintptr_t)HstPtrBegin;
      local_58.TgtPtrBegin = (uintptr_t)TgtPtrBegin;
      std::__cxx11::list<HostDataToTargetTy,_std::allocator<HostDataToTargetTy>_>::push_front
                (this_00,&local_58);
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      return 0;
    }
  } while (p_Var2[1]._M_prev != (_List_node_base *)HstPtrBegin);
  lVar1 = (long)p_Var2[2]._M_next;
  p_Var2 = p_Var2[2]._M_prev;
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  return -(uint)((_List_node_base *)TgtPtrBegin != p_Var2 || (long)HstPtrBegin + Size != lVar1);
}

Assistant:

int DeviceTy::associatePtr(void *HstPtrBegin, void *TgtPtrBegin, int64_t Size) {
  DataMapMtx.lock();

  // Check if entry exists
  for (auto &HT : HostDataToTargetMap) {
    if ((uintptr_t)HstPtrBegin == HT.HstPtrBegin) {
      // Mapping already exists
      bool isValid = HT.HstPtrBegin == (uintptr_t) HstPtrBegin &&
                     HT.HstPtrEnd == (uintptr_t) HstPtrBegin + Size &&
                     HT.TgtPtrBegin == (uintptr_t) TgtPtrBegin;
      DataMapMtx.unlock();
      if (isValid) {
        DP("Attempt to re-associate the same device ptr+offset with the same "
            "host ptr, nothing to do\n");
        return OFFLOAD_SUCCESS;
      } else {
        DP("Not allowed to re-associate a different device ptr+offset with the "
            "same host ptr\n");
        return OFFLOAD_FAIL;
      }
    }
  }

  // Mapping does not exist, allocate it
  HostDataToTargetTy newEntry;

  // Set up missing fields
  newEntry.HstPtrBase = (uintptr_t) HstPtrBegin;
  newEntry.HstPtrBegin = (uintptr_t) HstPtrBegin;
  newEntry.HstPtrEnd = (uintptr_t) HstPtrBegin + Size;
  newEntry.TgtPtrBegin = (uintptr_t) TgtPtrBegin;
  // refCount must be infinite
  newEntry.RefCount = INF_REF_CNT;

  DP("Creating new map entry: HstBase=" DPxMOD ", HstBegin=" DPxMOD ", HstEnd="
      DPxMOD ", TgtBegin=" DPxMOD "\n", DPxPTR(newEntry.HstPtrBase),
      DPxPTR(newEntry.HstPtrBegin), DPxPTR(newEntry.HstPtrEnd),
      DPxPTR(newEntry.TgtPtrBegin));
  HostDataToTargetMap.push_front(newEntry);

  DataMapMtx.unlock();

  return OFFLOAD_SUCCESS;
}